

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::containsAfterUintCast
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *haystack,
               deInt32 needle,Precision precision)

{
  deInt32 value;
  bool bVar1;
  reference puVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  Precision precision_local;
  deInt32 needle_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *haystack_local;
  
  it._M_node._0_4_ = precision;
  it._M_node._4_4_ = needle;
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (haystack);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (haystack);
    bVar1 = std::operator!=(&local_28,&local_30);
    value = it._M_node._4_4_;
    if (!bVar1) {
      return false;
    }
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_28);
    bVar1 = intEqualsAfterUintCast(value,*puVar2,(Precision)it._M_node);
    if (bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_28);
  }
  return true;
}

Assistant:

static bool containsAfterUintCast (const std::set<deUint32>& haystack, deInt32 needle, glu::Precision precision)
{
	for (std::set<deUint32>::const_iterator it = haystack.begin(); it != haystack.end(); ++it)
		if (intEqualsAfterUintCast(needle, *it, precision))
			return true;
	return false;
}